

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  undefined2 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined2 *puVar4;
  int iVar5;
  uint uVar6;
  undefined2 *puVar7;
  undefined8 *puVar8;
  longlong lVar9;
  ulong uVar10;
  int in_ECX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined2 *in_stack_00000008;
  unsigned_short s_2;
  uchar cs_2;
  HufDec pl_1;
  int i;
  unsigned_short s_1;
  uchar cs_1;
  int l;
  int j;
  unsigned_short s;
  uchar cs;
  HufDec pl;
  char *ie;
  unsigned_short *oe;
  unsigned_short *outb;
  int lc;
  longlong c;
  byte local_91;
  int local_90;
  byte local_75;
  int local_70;
  byte local_69;
  int local_68;
  int local_3c;
  ulong local_38;
  byte *local_20;
  
  puVar4 = in_stack_00000008;
  local_38 = 0;
  local_3c = 0;
  puVar7 = in_stack_00000008 + in_R9D;
  local_20 = in_RDX;
  do {
    if (in_RDX + (in_ECX + 7) / 8 <= local_20) {
      uVar6 = 8U - in_ECX & 7;
      local_38 = (long)local_38 >> (sbyte)uVar6;
      local_3c = local_3c - uVar6;
      while( true ) {
        if (local_3c < 1) {
          return (long)in_stack_00000008 - (long)puVar4 >> 1 == (long)in_R9D;
        }
        uVar2 = *(undefined8 *)
                 (in_RSI + (local_38 << (0xeU - (char)local_3c & 0x3f) & 0x3fff) * 0x10);
        local_90 = (int)uVar2;
        if ((char)uVar2 == '\0') break;
        local_3c = local_3c - (char)uVar2;
        if (local_90 >> 8 == in_R8D) {
          if (local_3c < 8) {
            local_38 = local_38 << 8 | (ulong)*local_20;
            local_3c = local_3c + 8;
            local_20 = local_20 + 1;
          }
          local_3c = local_3c + -8;
          local_91 = (byte)((long)local_38 >> ((byte)local_3c & 0x3f));
          if (puVar7 < in_stack_00000008 + (int)(uint)local_91) {
            return false;
          }
          uVar1 = in_stack_00000008[-1];
          while (local_91 != 0) {
            *in_stack_00000008 = uVar1;
            in_stack_00000008 = in_stack_00000008 + 1;
            local_91 = local_91 - 1;
          }
        }
        else {
          if (puVar7 <= in_stack_00000008) {
            return false;
          }
          *in_stack_00000008 = (short)((ulong)uVar2 >> 8);
          in_stack_00000008 = in_stack_00000008 + 1;
        }
      }
      return false;
    }
    local_38 = local_38 << 8 | (ulong)*local_20;
    local_3c = local_3c + 8;
    local_20 = local_20 + 1;
    while (0xd < local_3c) {
      puVar8 = (undefined8 *)
               (in_RSI + ((long)local_38 >> ((char)local_3c - 0xeU & 0x3f) & 0x3fffU) * 0x10);
      uVar2 = *puVar8;
      lVar3 = puVar8[1];
      local_68 = (int)uVar2;
      local_68 = local_68 >> 8;
      if ((char)uVar2 == '\0') {
        if (lVar3 == 0) {
          return false;
        }
        for (local_70 = 0; local_70 < local_68; local_70 = local_70 + 1) {
          lVar9 = hufLength(*(longlong *)(in_RDI + (long)*(int *)(lVar3 + (long)local_70 * 4) * 8));
          iVar5 = (int)lVar9;
          for (; local_3c < iVar5 && local_20 < in_RDX + (in_ECX + 7) / 8; local_3c = local_3c + 8)
          {
            local_38 = local_38 << 8 | (ulong)*local_20;
            local_20 = local_20 + 1;
          }
          if ((iVar5 <= local_3c) &&
             (uVar10 = hufCode(*(longlong *)
                                (in_RDI + (long)*(int *)(lVar3 + (long)local_70 * 4) * 8)),
             uVar10 == ((long)local_38 >> ((char)local_3c - (byte)lVar9 & 0x3f) &
                       (1L << ((byte)lVar9 & 0x3f)) - 1U))) {
            local_3c = local_3c - iVar5;
            if (*(int *)(lVar3 + (long)local_70 * 4) == in_R8D) {
              if (local_3c < 8) {
                local_38 = local_38 << 8 | (ulong)*local_20;
                local_3c = local_3c + 8;
                local_20 = local_20 + 1;
              }
              local_3c = local_3c + -8;
              local_75 = (byte)((long)local_38 >> ((byte)local_3c & 0x3f));
              if (puVar7 < in_stack_00000008 + (int)(uint)local_75) {
                return false;
              }
              uVar1 = in_stack_00000008[-1];
              while (local_75 != 0) {
                *in_stack_00000008 = uVar1;
                in_stack_00000008 = in_stack_00000008 + 1;
                local_75 = local_75 - 1;
              }
            }
            else {
              if (puVar7 <= in_stack_00000008) {
                return false;
              }
              *in_stack_00000008 = (short)*(undefined4 *)(lVar3 + (long)local_70 * 4);
              in_stack_00000008 = in_stack_00000008 + 1;
            }
            break;
          }
        }
        if (local_70 == local_68) {
          return false;
        }
      }
      else {
        local_3c = local_3c - (char)uVar2;
        if (local_68 == in_R8D) {
          if (local_3c < 8) {
            local_38 = local_38 << 8 | (ulong)*local_20;
            local_3c = local_3c + 8;
            local_20 = local_20 + 1;
          }
          local_3c = local_3c + -8;
          local_69 = (byte)((long)local_38 >> ((byte)local_3c & 0x3f));
          if (puVar7 < in_stack_00000008 + (int)(uint)local_69) {
            return false;
          }
          uVar1 = in_stack_00000008[-1];
          while (local_69 != 0) {
            *in_stack_00000008 = uVar1;
            in_stack_00000008 = in_stack_00000008 + 1;
            local_69 = local_69 - 1;
          }
        }
        else {
          if (puVar7 <= in_stack_00000008) {
            return false;
          }
          *in_stack_00000008 = (short)((ulong)uVar2 >> 8);
          in_stack_00000008 = in_stack_00000008 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool hufDecode(const long long *hcode,  // i : encoding table
               const HufDec *hdecod,    // i : decoding table
               const char *in,          // i : compressed input buffer
               int ni,                  // i : input size (in bits)
               int rlc,                 // i : run-length code
               int no,                  // i : expected output size (in bytes)
               unsigned short *out)     //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;
  unsigned short *oe = out + no;
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        getCode(pl.lit, rlc, c, lc, in, out, oe);
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              getCode(pl.p[j], rlc, c, lc, in, out, oe);
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      getCode(pl.lit, rlc, c, lc, in, out, oe);
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}